

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

HierarchicalInstanceSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  HierarchicalInstanceSyntax *pHVar1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *this_local;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index << 1);
  this_01 = TokenOrSyntax::node(this_00);
  pHVar1 = SyntaxNode::as<slang::syntax::HierarchicalInstanceSyntax>(this_01);
  return pHVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }